

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMParentNode::normalize(DOMParentNode *this)

{
  int iVar1;
  DOMChildNode *pDVar2;
  undefined4 extraout_var;
  DOMNode *local_20;
  DOMNode *next;
  DOMNode *kid;
  DOMParentNode *this_local;
  
  next = this->fFirstChild;
  while (next != (DOMNode *)0x0) {
    pDVar2 = castToChildImpl(next);
    local_20 = pDVar2->nextSibling;
    if (((local_20 == (DOMNode *)0x0) || (iVar1 = (*next->_vptr_DOMNode[4])(), iVar1 != 3)) ||
       (iVar1 = (*local_20->_vptr_DOMNode[4])(), iVar1 != 3)) {
      iVar1 = (*next->_vptr_DOMNode[4])();
      if (iVar1 == 1) {
        (*next->_vptr_DOMNode[0x14])();
      }
    }
    else {
      iVar1 = (*local_20->_vptr_DOMNode[0x28])();
      (*next->_vptr_DOMNode[0x2b])(next,CONCAT44(extraout_var,iVar1));
      removeChild(this,local_20);
      local_20 = next;
    }
    next = local_20;
  }
  return;
}

Assistant:

void DOMParentNode::normalize()
{
    DOMNode *kid, *next;
    for (kid = fFirstChild; kid != 0; kid = next)
    {
        next = castToChildImpl(kid)->nextSibling;

        // If kid and next are both Text nodes (but _not_ CDATASection,
        // which is a subclass of Text), they can be merged.
        if (next != 0 &&
            kid->getNodeType() == DOMNode::TEXT_NODE   &&
            next->getNodeType() == DOMNode::TEXT_NODE )
        {
            ((DOMTextImpl *) kid)->appendData(((DOMTextImpl *) next)->getData());
            // revisit:
            //   should I release the removed node?
            //   not released in case user still referencing it externally
            removeChild(next);
            next = kid; // Don't advance; there might be another.
        }

        // Otherwise it might be an Element, which is handled recursively
        else
            if (kid->getNodeType() == DOMNode::ELEMENT_NODE)
                kid->normalize();
    }

    // changed() will have occurred when the removeChild() was done,
    // so does not have to be reissued.
}